

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hash.c
# Opt level: O0

void beltHashStepG_internal(void *state)

{
  u32 *in_RDI;
  u32 *unaff_retaddr;
  belt_hash_st *st;
  undefined7 in_stack_ffffffffffffffe8;
  octet in_stack_ffffffffffffffef;
  u32 *h;
  
  *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RDI + 4);
  *(undefined8 *)(in_RDI + 10) = *(undefined8 *)(in_RDI + 6);
  *(undefined8 *)(in_RDI + 0x14) = *(undefined8 *)(in_RDI + 0xc);
  *(undefined8 *)(in_RDI + 0x16) = *(undefined8 *)(in_RDI + 0xe);
  *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RDI + 0x10);
  *(undefined8 *)(in_RDI + 0x1a) = *(undefined8 *)(in_RDI + 0x12);
  h = in_RDI;
  if (*(long *)(in_RDI + 0x24) != 0) {
    memSet(in_RDI,in_stack_ffffffffffffffef,0x143f1b);
    beltCompr2(unaff_retaddr,h,in_RDI,
               (void *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  }
  beltCompr(unaff_retaddr,h,in_RDI);
  *(undefined8 *)(in_RDI + 4) = *(undefined8 *)(in_RDI + 8);
  *(undefined8 *)(in_RDI + 6) = *(undefined8 *)(in_RDI + 10);
  return;
}

Assistant:

static void beltHashStepG_internal(void* state)
{
	belt_hash_st* st = (belt_hash_st*)state;
	// pre
	ASSERT(memIsValid(state, beltHash_keep()));
	// создать копии второй части st->ls и st->h
	beltBlockCopy(st->s1, st->ls + 4);
	beltBlockCopy(st->h1, st->h);
	beltBlockCopy(st->h1 + 4, st->h + 4);
	// есть необработанные данные?
	if (st->filled)
	{
		memSetZero(st->block + st->filled, 32 - st->filled);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
		beltBlockRevU32(st->block + 16);
#endif
		beltCompr2(st->ls + 4, st->h1, (u32*)st->block, st->stack);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block + 16);
		beltBlockRevU32(st->block);
#endif
	}
	// последний блок
	beltCompr(st->h1, st->ls, st->stack);
	// восстановить сохраненную часть st->ls
	beltBlockCopy(st->ls + 4, st->s1);
}